

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.cpp
# Opt level: O0

void __thiscall OpenMD::Bend::calcForce(Bend *this,RealType *angle,bool doParticlePot)

{
  long *plVar1;
  byte in_DL;
  double *in_RSI;
  StuntDouble *in_RDI;
  Vector<double,_3U> *v;
  Vector<double,_3U> *v2;
  Vector3d force2;
  Vector3d force3;
  Vector3d force1;
  RealType commonFactor2;
  RealType commonFactor1;
  RealType sinTheta;
  RealType dVdTheta;
  RealType theta;
  RealType cosTheta;
  RealType d23inv;
  RealType d23;
  Vector3d r23;
  RealType d21inv;
  RealType d21;
  Vector3d r21;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> *in_stack_fffffffffffffd88;
  Vector<double,_3U> *in_stack_fffffffffffffd90;
  StuntDouble *in_stack_fffffffffffffda0;
  Vector3d *in_stack_fffffffffffffe08;
  Snapshot *in_stack_fffffffffffffe10;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_a0;
  double local_98;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,0);
  StuntDouble::getPos(in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,1);
  StuntDouble::getPos(in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,2);
  StuntDouble::getPos(in_RDI);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,in_stack_fffffffffffffd90);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)&in_RDI->objType_);
  Snapshot::wrapVector(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_98 = Vector<double,_3U>::length((Vector<double,_3U> *)0x235edf);
  local_a0 = 1.0 / local_98;
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,in_stack_fffffffffffffd90);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)&in_RDI->objType_);
  Snapshot::wrapVector(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_d8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x235f5f);
  local_e0 = 1.0 / local_d8;
  local_e8 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffda0,
                            (Vector<double,_3U> *)in_RDI);
  local_e8 = local_e8 / (local_98 * local_d8);
  if (local_e8 <= 1.0) {
    if (local_e8 < -1.0) {
      local_e8 = -1.0;
    }
  }
  else {
    local_e8 = 1.0;
  }
  local_f0 = acos(local_e8);
  plVar1 = (long *)(in_RDI->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (**(code **)(*plVar1 + 0x10))
            (local_f0,plVar1,
             &(in_RDI->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             &local_f8);
  local_100 = sqrt(-local_e8 * local_e8 + 1.0);
  if (ABS(local_100) < 1e-06) {
    local_100 = 1e-06;
  }
  v = (Vector<double,_3U> *)((local_f8 / local_100) * local_a0);
  v2 = (Vector<double,_3U> *)((local_f8 / local_100) * local_e0);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)in_stack_fffffffffffffd90);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)in_stack_fffffffffffffd90);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)in_stack_fffffffffffffd90);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,in_stack_fffffffffffffd90);
  OpenMD::operator*((double)in_RDI,in_stack_fffffffffffffd90);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffd90,v);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)v2);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)v2);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)v2);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,v2);
  OpenMD::operator*((double)in_RDI,v2);
  Vector3<double>::Vector3((Vector3<double> *)v2,v);
  OpenMD::operator+((Vector<double,_3U> *)in_RDI,v2);
  Vector3<double>::Vector3((Vector3<double> *)v2,v);
  Vector<double,_3U>::operator*=(v2,(double)v);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,0);
  StuntDouble::addFrc(in_stack_fffffffffffffda0,(Vector3d *)in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,1);
  StuntDouble::addFrc(in_stack_fffffffffffffda0,(Vector3d *)in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,2);
  StuntDouble::addFrc(in_stack_fffffffffffffda0,(Vector3d *)in_RDI);
  if ((local_11 & 1) != 0) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,0);
    StuntDouble::addParticlePot(in_stack_fffffffffffffda0,(RealType *)in_RDI);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,1);
    StuntDouble::addParticlePot(in_stack_fffffffffffffda0,(RealType *)in_RDI);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,2);
    StuntDouble::addParticlePot(in_stack_fffffffffffffda0,(RealType *)in_RDI);
  }
  *local_10 = (local_f0 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void Bend::calcForce(RealType& angle, bool doParticlePot) {
    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = atoms_[2]->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    RealType d21 = r21.length();

    RealType d21inv = 1.0 / d21;

    Vector3d r23 = pos3 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r23);
    RealType d23 = r23.length();

    RealType d23inv = 1.0 / d23;

    RealType cosTheta = dot(r21, r23) / (d21 * d23);

    // check roundoff
    if (cosTheta > 1.0) {
      cosTheta = 1.0;
    } else if (cosTheta < -1.0) {
      cosTheta = -1.0;
    }

    RealType theta = acos(cosTheta);

    RealType dVdTheta;

    bendType_->calcForce(theta, potential_, dVdTheta);

    RealType sinTheta = sqrt(1.0 - cosTheta * cosTheta);

    if (fabs(sinTheta) < 1.0E-6) { sinTheta = 1.0E-6; }

    RealType commonFactor1 = dVdTheta / sinTheta * d21inv;
    RealType commonFactor2 = dVdTheta / sinTheta * d23inv;

    Vector3d force1 = commonFactor1 * (r23 * d23inv - r21 * d21inv * cosTheta);
    Vector3d force3 = commonFactor2 * (r21 * d21inv - r23 * d23inv * cosTheta);

    // Total force in current bend is zero
    Vector3d force2 = force1 + force3;
    force2 *= -1.0;

    atoms_[0]->addFrc(force1);
    atoms_[1]->addFrc(force2);
    atoms_[2]->addFrc(force3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
    }

    angle = theta / Constants::PI * 180.0;
  }